

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryTargetAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              int *value)

{
  int iVar1;
  undefined1 *puVar2;
  int exists;
  xnvCtrlQueryAttributeReq *req;
  xnvCtrlQueryAttributeReply rep;
  XExtDisplayInfo *info;
  int *value_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  attribute_local = target_id;
  display_mask_local = target_type;
  _target_id_local = dpy;
  rep._24_8_ = find_display(dpy);
  if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
     (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
          (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    XMissingExtension(_target_id_local,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    XNVCTRLCheckTargetData
              (_target_id_local,(XExtDisplayInfo *)rep._24_8_,(int *)&display_mask_local,
               (int *)&attribute_local);
    if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
      (*_target_id_local->lock_fns->lock_display)(_target_id_local);
    }
    puVar2 = (undefined1 *)_XGetRequest(_target_id_local,2,0x10);
    *puVar2 = (char)*(undefined4 *)(*(long *)(rep._24_8_ + 0x10) + 4);
    puVar2[1] = 2;
    *(short *)(puVar2 + 6) = (short)display_mask_local;
    *(short *)(puVar2 + 4) = (short)attribute_local;
    *(uint *)(puVar2 + 8) = display_mask;
    *(uint *)(puVar2 + 0xc) = attribute;
    iVar1 = _XReply(_target_id_local,&req,0,1);
    if (iVar1 == 0) {
      if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
        (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
      }
      if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*_target_id_local->synchandler)(_target_id_local);
      }
      dpy_local._4_4_ = 0;
    }
    else {
      if (value != (int *)0x0) {
        *value = rep.length;
      }
      if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
        (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
      }
      if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*_target_id_local->synchandler)(_target_id_local);
      }
      dpy_local._4_1_ = rep.type;
      dpy_local._5_1_ = rep.pad0;
      dpy_local._6_2_ = rep.sequenceNumber;
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLQueryTargetAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int *value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryAttributeReply rep;
    xnvCtrlQueryAttributeReq   *req;
    Bool exists;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    if (value) *value = rep.value;
    exists = rep.flags;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}